

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O3

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_primitive_box
          (TrimeshPrimitiveManager *this,int prim_index,cbtAABB *primbox)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 in_register_00000034;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  cbtPrimitiveTriangle triangle;
  float local_60;
  float local_5c;
  float local_58 [2];
  float local_50;
  float local_4c;
  float local_48 [2];
  float local_40;
  float local_3c;
  float local_38 [6];
  float local_20;
  
  local_20 = 0.01;
  (*(this->super_cbtPrimitiveManagerBase)._vptr_cbtPrimitiveManagerBase[5])
            (this,CONCAT44(in_register_00000034,prim_index),&local_60);
  pfVar6 = &local_50;
  pfVar7 = pfVar6;
  fVar1 = local_50;
  if (local_40 < local_50) {
    pfVar7 = &local_40;
    fVar1 = local_40;
  }
  if (local_60 <= fVar1) {
    pfVar7 = &local_60;
  }
  pfVar8 = &local_4c;
  pfVar10 = pfVar8;
  fVar1 = local_4c;
  if (local_3c < local_4c) {
    pfVar10 = &local_3c;
    fVar1 = local_3c;
  }
  if (local_5c <= fVar1) {
    pfVar10 = &local_5c;
  }
  pfVar9 = local_48;
  pfVar11 = pfVar9;
  fVar1 = local_48[0];
  if (local_38[0] < local_48[0]) {
    pfVar11 = local_38;
    fVar1 = local_38[0];
  }
  if (local_58[0] <= fVar1) {
    pfVar11 = local_58;
  }
  if (local_50 < local_40) {
    pfVar6 = &local_40;
    local_50 = local_40;
  }
  if (local_50 <= local_60) {
    pfVar6 = &local_60;
  }
  if (local_4c < local_3c) {
    pfVar8 = &local_3c;
    local_4c = local_3c;
  }
  if (local_4c <= local_5c) {
    pfVar8 = &local_5c;
  }
  fVar1 = *pfVar10;
  fVar2 = *pfVar11;
  fVar3 = *pfVar6;
  fVar4 = *pfVar8;
  if (local_48[0] < local_38[0]) {
    pfVar9 = local_38;
    local_48[0] = local_38[0];
  }
  if (local_48[0] <= local_58[0]) {
    pfVar9 = local_58;
  }
  fVar5 = *pfVar9;
  (primbox->m_min).m_floats[0] = *pfVar7 - local_20;
  (primbox->m_min).m_floats[1] = fVar1 - local_20;
  (primbox->m_min).m_floats[2] = fVar2 - local_20;
  (primbox->m_max).m_floats[0] = local_20 + fVar3;
  (primbox->m_max).m_floats[1] = local_20 + fVar4;
  (primbox->m_max).m_floats[2] = local_20 + fVar5;
  return;
}

Assistant:

virtual void get_primitive_box(int prim_index, cbtAABB& primbox) const
		{
			cbtPrimitiveTriangle triangle;
			get_primitive_triangle(prim_index, triangle);
			primbox.calc_from_triangle_margin(
				triangle.m_vertices[0],
				triangle.m_vertices[1], triangle.m_vertices[2], triangle.m_margin);
		}